

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int evthread_notify_base_default(event_base *base)

{
  int iVar1;
  ulong in_RAX;
  ssize_t sVar2;
  int *piVar3;
  ulong uStack_8;
  char buf [1];
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  sVar2 = write(base->th_notify_fd[1],buf,1);
  iVar1 = 0;
  if ((int)sVar2 < 0) {
    piVar3 = __errno_location();
    iVar1 = -(uint)(*piVar3 != 0xb);
  }
  return iVar1;
}

Assistant:

static int
evthread_notify_base_default(struct event_base *base)
{
	char buf[1];
	int r;
	buf[0] = (char) 0;
#ifdef _WIN32
	r = send(base->th_notify_fd[1], buf, 1, 0);
#else
	r = write(base->th_notify_fd[1], buf, 1);
#endif
	return (r < 0 && ! EVUTIL_ERR_IS_EAGAIN(errno)) ? -1 : 0;
}